

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::CalcRoll(LTAircraft *this,double _prevHeading)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  int __x;
  Aircraft *in_RDI;
  float *this_00;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double newRoll;
  double timeFullCircle;
  double partOfCircle;
  float in_stack_ffffffffffffff7c;
  Aircraft *in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff90;
  double dVar5;
  double in_stack_ffffffffffffff98;
  double local_50;
  double local_48;
  
  positionTy::heading((positionTy *)&in_RDI[1].v_y);
  dVar4 = HeadingDiff(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_50 = currCycle.diffTime / (dVar4 / 360.0);
  bVar1 = XPMP2::Aircraft::IsOnGrnd(in_RDI);
  if (bVar1) {
    dVar4 = GetSpeed_m_s((LTAircraft *)0x1969cc);
    if ((0.2 <= dVar4) || (bVar1 = FlightModel::isGlider((FlightModel *)0x1969ee), !bVar1)) {
      pdVar3 = positionTy::roll((positionTy *)&in_RDI[1].v_y);
      *pdVar3 = 0.0;
    }
    else {
      pdVar3 = positionTy::roll((positionTy *)&in_RDI[1].v_y);
      *pdVar3 = 7.0;
    }
    std::isnan(local_50);
    XPMP2::Aircraft::SetNoseWheelAngle(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  else {
    __x = (int)in_RDI;
    XPMP2::Aircraft::SetNoseWheelAngle(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    uVar2 = std::isnan(local_50);
    if ((uVar2 & 1) == 0) {
      std::abs(__x);
      if (*(double *)(*(long *)&in_RDI[1].modeS_id + 0xa0) <= extraout_XMM0_Qa) {
        local_50 = (*(double *)(*(long *)&in_RDI[1].modeS_id + 0xa8) *
                   *(double *)(*(long *)&in_RDI[1].modeS_id + 0xa0)) / local_50;
      }
      else {
        local_50 = (double)(*(ulong *)(*(long *)&in_RDI[1].modeS_id + 0xa8) & 0x7fffffffffffffff |
                           (ulong)local_50 & 0x8000000000000000);
      }
      local_48 = local_50;
    }
    else {
      pdVar3 = positionTy::roll((positionTy *)&in_RDI[1].v_y);
      local_48 = *pdVar3;
    }
    this_00 = &in_RDI[1].v_y;
    positionTy::roll((positionTy *)this_00);
    std::abs((int)this_00);
    if (extraout_XMM0_Qa_00 <= currCycle.diffTime * *(double *)(*(long *)&in_RDI[1].modeS_id + 0xb0)
       ) {
      pdVar3 = positionTy::roll((positionTy *)&in_RDI[1].v_y);
      *pdVar3 = local_48;
    }
    else {
      pdVar3 = positionTy::roll((positionTy *)&in_RDI[1].v_y);
      dVar4 = currCycle.diffTime;
      if (*pdVar3 <= local_48) {
        dVar5 = *(double *)(*(long *)&in_RDI[1].modeS_id + 0xb0);
        pdVar3 = positionTy::roll((positionTy *)&in_RDI[1].v_y);
        *pdVar3 = dVar4 * dVar5 + *pdVar3;
      }
      else {
        dVar4 = *(double *)(*(long *)&in_RDI[1].modeS_id + 0xb0);
        dVar5 = currCycle.diffTime;
        pdVar3 = positionTy::roll((positionTy *)&in_RDI[1].v_y);
        *pdVar3 = -dVar5 * dVar4 + *pdVar3;
      }
    }
  }
  return;
}

Assistant:

void LTAircraft::CalcRoll (double _prevHeading)
{
    // How much of a turn did we do since last frame?
    const double partOfCircle = HeadingDiff(_prevHeading, ppos.heading()) / 360.0;
    const double timeFullCircle = currCycle.diffTime / partOfCircle;  // at current turn rate (if small then we turn _very_ fast!)

    // On the ground we should actually better be levelled, but we turn the nose wheel
    if (IsOnGrnd()) {
        // except...if we are a stopped glider ;-)
        if (GetSpeed_m_s() < 0.2 && pMdl->isGlider())
            ppos.roll() = MDL_GLIDER_STOP_ROLL;
        else
            ppos.roll() = 0.0;
        
        // Nose wheel steering: Hm...we would need to know a lot about the plane's
        // geometry to do that exactly right...so we just guess: 30° for a standard turn:
        SetNoseWheelAngle(std::isnan(timeFullCircle) ? 0.0f :
                          30.0f * float(pMdl->TAXI_TURN_TIME / timeFullCircle));
        return;
    }
    
    // In the air we make sure nose wheel looks straight
    SetNoseWheelAngle(0.0f);
    
    // For the roll we assume that max bank angle is applied for the tightest turn.
    // If we are turning more slowly then we apply less bank angle.
    const double newRoll = (std::isnan(timeFullCircle) ? ppos.roll() :
                            std::abs(timeFullCircle) < pMdl->MIN_FLIGHT_TURN_TIME ? std::copysign(pMdl->ROLL_MAX_BANK,timeFullCircle) :
                            pMdl->ROLL_MAX_BANK * pMdl->MIN_FLIGHT_TURN_TIME / timeFullCircle);
    // safeguard against to harsh roll rates:
    if (std::abs(ppos.roll()-newRoll) > currCycle.diffTime * pMdl->ROLL_RATE) {
        if (newRoll < ppos.roll()) ppos.roll() -= currCycle.diffTime * pMdl->ROLL_RATE;
        else                       ppos.roll() += currCycle.diffTime * pMdl->ROLL_RATE;
    }
    else
        ppos.roll() = newRoll;
}